

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
LiteTest_EnumNameToValue_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~LiteTest_EnumNameToValue_Test
          (LiteTest_EnumNameToValue_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, EnumNameToValue) {
  proto2_unittest::ForeignEnumLite value;

  ASSERT_TRUE(
      proto2_unittest::ForeignEnumLite_Parse("FOREIGN_LITE_FOO", &value));
  EXPECT_EQ(proto2_unittest::FOREIGN_LITE_FOO, value);

  ASSERT_TRUE(
      proto2_unittest::ForeignEnumLite_Parse("FOREIGN_LITE_BAR", &value));
  EXPECT_EQ(proto2_unittest::FOREIGN_LITE_BAR, value);

  ASSERT_TRUE(
      proto2_unittest::ForeignEnumLite_Parse("FOREIGN_LITE_BAZ", &value));
  EXPECT_EQ(proto2_unittest::FOREIGN_LITE_BAZ, value);

  // Non-existent values
  EXPECT_FALSE(proto2_unittest::ForeignEnumLite_Parse("E", &value));
  EXPECT_FALSE(
      proto2_unittest::ForeignEnumLite_Parse("FOREIGN_LITE_C", &value));
  EXPECT_FALSE(proto2_unittest::ForeignEnumLite_Parse("G", &value));
}